

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O0

defV * __thiscall
helics::apps::SineGenerator::generate_abi_cxx11_(SineGenerator *this,Time signalTime)

{
  double dVar1;
  bool bVar2;
  undefined8 in_RDX;
  long in_RSI;
  defV *in_RDI;
  double dVar3;
  double dVar4;
  TimeRepresentation<count_time<9,_long>_> t1;
  double newValue;
  TimeRepresentation<count_time<9,_long>_> tdiff;
  TimeRepresentation<count_time<9,_long>_> dt;
  double *in_stack_ffffffffffffff68;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff70;
  defV *this_00;
  TimeRepresentation<count_time<9,_long>_> local_60;
  TimeRepresentation<count_time<9,_long>_> local_58;
  baseType local_50;
  baseType local_48;
  double local_40;
  baseType local_38;
  baseType local_30;
  TimeRepresentation<count_time<9,_long>_> local_28;
  baseType local_20;
  undefined8 local_10;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  local_20 = (baseType)
             TimeRepresentation<count_time<9,_long>_>::operator-
                       ((TimeRepresentation<count_time<9,_long>_> *)in_RDI,
                        in_stack_ffffffffffffff70.internalTimeCode);
  local_28 = TimeRepresentation<count_time<9,_long>_>::operator-
                       ((TimeRepresentation<count_time<9,_long>_> *)this_00,
                        in_stack_ffffffffffffff70.internalTimeCode);
  local_30 = local_20;
  dVar3 = ::operator*((double)in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  *(double *)(in_RSI + 0x40) = dVar3 + *(double *)(in_RSI + 0x40);
  local_38 = local_20;
  dVar3 = ::operator*((double)in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  *(double *)(in_RSI + 0x50) = dVar3 + *(double *)(in_RSI + 0x50);
  dVar3 = *(double *)(in_RSI + 0x38);
  dVar1 = *(double *)(in_RSI + 0x50);
  local_48 = local_28.internalTimeCode;
  dVar4 = ::operator*((double)in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  dVar4 = sin(dVar4 * 6.283185307179586 + *(double *)(in_RSI + 0x48));
  local_40 = dVar1 * dVar4 + dVar3;
  if (*(double *)(in_RSI + 0x40) <= 0.0) {
    t1.internalTimeCode = 0x476812f9cf7920e3;
  }
  else {
    t1.internalTimeCode = (baseType)(1.0 / *(double *)(in_RSI + 0x40));
  }
  *(baseType *)(in_RSI + 0x68) = t1.internalTimeCode;
  while( true ) {
    local_50 = local_28.internalTimeCode;
    bVar2 = operator>(t1,(double)in_stack_ffffffffffffff68);
    if (!bVar2) break;
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)t1.internalTimeCode,
               (double)in_stack_ffffffffffffff68);
    TimeRepresentation<count_time<9,_long>_>::operator-=(&local_28,&local_58);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)t1.internalTimeCode,
               (double)in_stack_ffffffffffffff68);
    TimeRepresentation<count_time<9,_long>_>::operator+=
              ((TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x70),&local_60);
  }
  *(undefined8 *)(in_RSI + 8) = local_10;
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::variant<double,void,void,double,void>
            ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)t1.internalTimeCode,in_stack_ffffffffffffff68);
  return in_RDI;
}

Assistant:

defV SineGenerator::generate(Time signalTime)
    {
        auto dt = signalTime - lastTime;
        auto tdiff = signalTime - lastCycle;
        // account for the frequency shift
        frequency += dfdt * dt;
        amplitude += dAdt * dt;
        // compute the sine wave component
        double newValue = level + amplitude * sin(2.0 * pi * (frequency * tdiff) + offset);
        period = (frequency > 0.0) ? 1.0 / frequency : 1e36;
        while (tdiff > period) {
            tdiff -= period;
            lastCycle += period;
        }
        lastTime = signalTime;
        return newValue;
    }